

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  undefined4 extraout_EAX;
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int overflow;
  secp256k1_scalar factor;
  secp256k1_ge p;
  secp256k1_gej pt;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  int local_a34;
  secp256k1_scalar local_a30;
  secp256k1_strauss_state local_a10;
  secp256k1_ge local_9f8;
  secp256k1_gej local_990;
  secp256k1_fe local_8f8 [8];
  secp256k1_ge local_778 [8];
  secp256k1_strauss_point_state local_438;
  
  local_a34 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_tweak_mul_cold_3();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    if (tweak32 == (uchar *)0x0) {
      secp256k1_ec_pubkey_tweak_mul_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_a30,tweak32,&local_a34);
    if (local_a34 == 0) {
      iVar1 = secp256k1_pubkey_load(ctx,&local_9f8,pubkey);
      bVar2 = iVar1 != 0;
    }
    else {
      bVar2 = false;
    }
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (bVar2 != false) {
      secp256k1_scalar_verify(&local_a30);
      auVar3._0_4_ = -(uint)((int)local_a30.d[2] == 0 && (int)local_a30.d[0] == 0);
      auVar3._4_4_ = -(uint)(local_a30.d[2]._4_4_ == 0 && local_a30.d[0]._4_4_ == 0);
      auVar3._8_4_ = -(uint)((int)local_a30.d[3] == 0 && (int)local_a30.d[1] == 0);
      auVar3._12_4_ = -(uint)(local_a30.d[3]._4_4_ == 0 && local_a30.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar3);
      if (iVar1 == 0xf) {
        bVar2 = false;
      }
      else {
        secp256k1_gej_set_ge(&local_990,&local_9f8);
        local_a10.aux = local_8f8;
        local_a10.pre_a = local_778;
        local_a10.ps = &local_438;
        secp256k1_ecmult_strauss_wnaf
                  (&local_a10,&local_990,1,&local_990,&local_a30,&secp256k1_scalar_zero);
        secp256k1_ge_set_gej(&local_9f8,&local_990);
        secp256k1_ge_to_bytes(pubkey->data,&local_9f8);
      }
    }
    return (uint)bVar2;
  }
  secp256k1_ec_pubkey_tweak_mul_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}